

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_image.h
# Opt level: O1

void stbi__vertical_flip(void *image,int w,int h,int bytes_per_pixel)

{
  ulong uVar1;
  size_t __n;
  void *__src;
  void *__src_00;
  ulong uVar2;
  stbi_uc temp [2048];
  ulong local_860;
  undefined1 local_838 [2056];
  
  if (0 < h >> 1) {
    uVar1 = (long)bytes_per_pixel * (long)w;
    local_860 = 0;
    do {
      if (uVar1 != 0) {
        __src = (void *)((long)(int)(~(uint)local_860 + h) * uVar1 + (long)image);
        __src_00 = (void *)(uVar1 * local_860 + (long)image);
        uVar2 = uVar1;
        do {
          __n = 0x800;
          if (uVar2 < 0x800) {
            __n = uVar2;
          }
          memcpy(local_838,__src_00,__n);
          memcpy(__src_00,__src,__n);
          memcpy(__src,local_838,__n);
          __src_00 = (void *)((long)__src_00 + __n);
          __src = (void *)((long)__src + __n);
          uVar2 = uVar2 - __n;
        } while (uVar2 != 0);
      }
      local_860 = local_860 + 1;
    } while (local_860 != (uint)(h >> 1));
  }
  return;
}

Assistant:

static void stbi__vertical_flip(void *image, int w, int h, int bytes_per_pixel) {
    int row;
    size_t bytes_per_row = (size_t) w * bytes_per_pixel;
    stbi_uc temp[2048];
    stbi_uc *bytes = (stbi_uc *) image;

    for (row = 0; row < (h >> 1); row++) {
        stbi_uc *row0 = bytes + row * bytes_per_row;
        stbi_uc *row1 = bytes + (h - row - 1) * bytes_per_row;
        // swap row0 with row1
        size_t bytes_left = bytes_per_row;
        while (bytes_left) {
            size_t bytes_copy = (bytes_left < sizeof(temp)) ? bytes_left : sizeof(temp);
            memcpy(temp, row0, bytes_copy);
            memcpy(row0, row1, bytes_copy);
            memcpy(row1, temp, bytes_copy);
            row0 += bytes_copy;
            row1 += bytes_copy;
            bytes_left -= bytes_copy;
        }
    }
}